

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImDrawList **ppIVar4;
  ImDrawList **ppIVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  uVar6 = this->Layers[0].Size;
  iVar2 = this->Layers[0].Capacity;
  iVar7 = this->Layers[1].Size + uVar6;
  if (iVar2 < iVar7) {
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar8 <= iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar5 = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      ppIVar4 = this->Layers[0].Data;
      if (ppIVar4 != (ImDrawList **)0x0) {
        memcpy(ppIVar5,ppIVar4,(long)this->Layers[0].Size << 3);
        ppIVar4 = this->Layers[0].Data;
        if ((ppIVar4 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      this->Layers[0].Data = ppIVar5;
      this->Layers[0].Capacity = iVar8;
    }
  }
  this->Layers[0].Size = iVar7;
  uVar3 = this->Layers[1].Size;
  if ((ulong)uVar3 != 0) {
    if ((((int)uVar6 < 0) || (this->Layers[0].Size <= (int)uVar6)) || ((int)uVar3 < 1)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,"T &ImVector<ImDrawList *>::operator[](int) [T = ImDrawList *]");
    }
    memcpy(this->Layers[0].Data + uVar6,this->Layers[1].Data,(ulong)uVar3 << 3);
    iVar2 = this->Layers[1].Capacity;
    if (iVar2 < 0) {
      uVar6 = iVar2 / 2 + iVar2;
      uVar9 = 0;
      if (0 < (int)uVar6) {
        uVar9 = (ulong)uVar6;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar5 = (ImDrawList **)(*GImAllocatorAllocFunc)(uVar9 * 8,GImAllocatorUserData);
      ppIVar4 = this->Layers[1].Data;
      if (ppIVar4 != (ImDrawList **)0x0) {
        memcpy(ppIVar5,ppIVar4,(long)this->Layers[1].Size << 3);
        ppIVar4 = this->Layers[1].Data;
        if ((ppIVar4 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      this->Layers[1].Data = ppIVar5;
      this->Layers[1].Capacity = (int)uVar9;
    }
    this->Layers[1].Size = 0;
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}